

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

uint64_t __thiscall spvtools::opt::analysis::Constant::GetZeroExtendedValue(Constant *this)

{
  int iVar1;
  uint32_t uVar2;
  Type *pTVar3;
  undefined4 extraout_var;
  ScalarConstant *this_00;
  undefined4 extraout_var_01;
  IntConstant *ic;
  uint64_t value;
  uint32_t width;
  Integer *int_type;
  Constant *this_local;
  undefined4 extraout_var_00;
  
  pTVar3 = type(this);
  iVar1 = (*pTVar3->_vptr_Type[10])();
  if ((Integer *)CONCAT44(extraout_var,iVar1) == (Integer *)0x0) {
    __assert_fail("int_type != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                  ,0x6b,"uint64_t spvtools::opt::analysis::Constant::GetZeroExtendedValue() const");
  }
  uVar2 = Integer::width((Integer *)CONCAT44(extraout_var,iVar1));
  if (uVar2 < 0x41) {
    ic = (IntConstant *)0x0;
    iVar1 = (*this->_vptr_Constant[0xe])();
    this_00 = (ScalarConstant *)CONCAT44(extraout_var_00,iVar1);
    if (this_00 == (ScalarConstant *)0x0) {
      iVar1 = (*this->_vptr_Constant[0x16])();
      if (CONCAT44(extraout_var_01,iVar1) == 0) {
        __assert_fail("AsNullConstant() && \"Must be an integer constant.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                      ,0x77,
                      "uint64_t spvtools::opt::analysis::Constant::GetZeroExtendedValue() const");
      }
    }
    else if (uVar2 < 0x21) {
      uVar2 = ScalarConstant::GetU32BitValue(this_00);
      ic = (IntConstant *)(ulong)uVar2;
    }
    else {
      ic = (IntConstant *)ScalarConstant::GetU64BitValue(this_00);
    }
    return (uint64_t)ic;
  }
  __assert_fail("width <= 64",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                ,0x6d,"uint64_t spvtools::opt::analysis::Constant::GetZeroExtendedValue() const");
}

Assistant:

uint64_t Constant::GetZeroExtendedValue() const {
  const auto* int_type = type()->AsInteger();
  assert(int_type != nullptr);
  const auto width = int_type->width();
  assert(width <= 64);

  uint64_t value = 0;
  if (const IntConstant* ic = AsIntConstant()) {
    if (width <= 32) {
      value = ic->GetU32BitValue();
    } else {
      value = ic->GetU64BitValue();
    }
  } else {
    assert(AsNullConstant() && "Must be an integer constant.");
  }
  return value;
}